

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.c
# Opt level: O1

wchar_t hist_command(EditLine *el,wchar_t argc,wchar_t **argv)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  wchar_t wVar4;
  ulong uVar5;
  char *__s;
  size_t sVar6;
  char *mbdst;
  HistoryW *h;
  wchar_t *pwVar7;
  char *__ptr;
  HistEventW ev;
  ulong local_58;
  HistEventW local_40;
  
  pvVar1 = (el->el_history).ref;
  if (pvVar1 != (void *)0x0) {
    if ((argc == L'\x01') || (iVar3 = wcscmp(argv[1],anon_var_dwarf_6ea4 + 6), iVar3 == 0)) {
      if ((el->el_flags & L'@') == L'\0') {
        pwVar7 = (wchar_t *)0x0;
        wVar4 = (*(el->el_history).fun)(pvVar1,&(el->el_history).ev,L'\x04');
        if (wVar4 != L'\xffffffff') {
          pwVar7 = (el->el_history).ev.str;
        }
      }
      else {
        pwVar7 = hist_convert(el,L'\x04',(void *)0x0);
      }
      if (pwVar7 == (wchar_t *)0x0) {
        __ptr = (char *)0x0;
      }
      else {
        local_58 = 1;
        __ptr = (char *)0x0;
        uVar5 = 0;
        do {
          __s = ct_encode_string(pwVar7,&el->el_scratch);
          sVar6 = strlen(__s);
          if (sVar6 == 0) {
            sVar6 = 0;
          }
          else if (__s[sVar6 - 1] == '\n') {
            __s[sVar6 - 1] = '\0';
            sVar6 = sVar6 - 1;
          }
          mbdst = __ptr;
          if (sVar6 * 4 + 1 < uVar5) {
LAB_00109d3f:
            strvis(mbdst,__s,L'\x10');
            fprintf((FILE *)el->el_outfile,"%d\t%s\n",local_58,mbdst);
            bVar2 = true;
            local_58 = (ulong)((int)local_58 + 1);
            __ptr = mbdst;
          }
          else {
            uVar5 = sVar6 * 4 + 0x401;
            mbdst = (char *)realloc(__ptr,uVar5);
            if (mbdst != (char *)0x0) goto LAB_00109d3f;
            free(__ptr);
            bVar2 = false;
          }
          if (!bVar2) {
            return L'\xffffffff';
          }
          if ((el->el_flags & L'@') == L'\0') {
            wVar4 = (*(el->el_history).fun)((el->el_history).ref,&(el->el_history).ev,L'\x05');
            pwVar7 = (wchar_t *)0x0;
            if (wVar4 != L'\xffffffff') {
              pwVar7 = (el->el_history).ev.str;
            }
          }
          else {
            pwVar7 = hist_convert(el,L'\x05',(void *)0x0);
          }
        } while (pwVar7 != (wchar_t *)0x0);
      }
      free(__ptr);
      return L'\0';
    }
    if (argc == L'\x03') {
      uVar5 = wcstol(argv[2],(wchar_t **)0x0,0);
      pwVar7 = argv[1];
      iVar3 = wcscmp(pwVar7,anon_var_dwarf_5c16);
      if (iVar3 == 0) {
        h = (HistoryW *)(el->el_history).ref;
        wVar4 = L'\x01';
      }
      else {
        iVar3 = wcscmp(pwVar7,anon_var_dwarf_5c20);
        if (iVar3 != 0) {
          return L'\xffffffff';
        }
        h = (HistoryW *)(el->el_history).ref;
        wVar4 = L'\x14';
      }
      wVar4 = history_w(h,&local_40,wVar4,uVar5 & 0xffffffff);
      return wVar4;
    }
  }
  return L'\xffffffff';
}

Assistant:

libedit_private int
hist_command(EditLine *el, int argc, const wchar_t **argv)
{
	const wchar_t *str;
	int num;
	HistEventW ev;

	if (el->el_history.ref == NULL)
		return -1;

	if (argc == 1 || wcscmp(argv[1], L"list") == 0) {
		size_t maxlen = 0;
		char *buf = NULL;
		int hno = 1;
		 /* List history entries */

		for (str = HIST_LAST(el); str != NULL; str = HIST_PREV(el)) {
			char *ptr =
			    ct_encode_string(str, &el->el_scratch);
			size_t len = strlen(ptr);
			if (len > 0 && ptr[len - 1] == '\n') 
				ptr[--len] = '\0';
			len = len * 4 + 1;
			if (len >= maxlen) {
				maxlen = len + 1024;
				char *nbuf = el_realloc(buf, maxlen);
				if (nbuf == NULL) {
					el_free(buf);
					return -1;
				}
				buf = nbuf;
			}
			strvis(buf, ptr, VIS_NL);
			(void) fprintf(el->el_outfile, "%d\t%s\n",
			    hno++, buf);
		}
		el_free(buf);
		return 0;
	}

	if (argc != 3)
		return -1;

	num = (int)wcstol(argv[2], NULL, 0);

	if (wcscmp(argv[1], L"size") == 0)
		return history_w(el->el_history.ref, &ev, H_SETSIZE, num);

	if (wcscmp(argv[1], L"unique") == 0)
		return history_w(el->el_history.ref, &ev, H_SETUNIQUE, num);

	return -1;
}